

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<int>::emplaceRealloc<>(SmallVectorBase<int> *this,pointer pos)

{
  pointer piVar1;
  ulong uVar2;
  size_type sVar3;
  pointer __dest;
  ulong uVar4;
  EVP_PKEY_CTX *ctx;
  long lVar5;
  
  if (this->len != 0x1fffffffffffffff) {
    uVar4 = this->len + 1;
    uVar2 = this->cap;
    if (uVar4 < uVar2 * 2) {
      uVar4 = uVar2 * 2;
    }
    if (0x1fffffffffffffff - uVar2 < uVar2) {
      uVar4 = 0x1fffffffffffffff;
    }
    lVar5 = (long)pos - (long)this->data_;
    __dest = (pointer)operator_new(uVar4 * 4);
    piVar1 = (pointer)((long)__dest + lVar5);
    *(undefined4 *)((long)__dest + lVar5) = 0;
    ctx = (EVP_PKEY_CTX *)this->data_;
    sVar3 = this->len;
    if (ctx + (sVar3 * 4 - (long)pos) == (EVP_PKEY_CTX *)0x0) {
      if (sVar3 != 0) {
        memmove(__dest,ctx,sVar3 << 2);
      }
    }
    else {
      if (ctx != (EVP_PKEY_CTX *)pos) {
        memmove(__dest,ctx,(long)pos - (long)ctx);
      }
      memcpy(piVar1 + 1,pos,(size_t)(ctx + (sVar3 * 4 - (long)pos)));
      ctx = (EVP_PKEY_CTX *)pos;
    }
    cleanup(this,ctx);
    this->len = this->len + 1;
    this->cap = uVar4;
    this->data_ = __dest;
    return piVar1;
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}